

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O0

aiVector3D __thiscall Assimp::D3MF::XmlSerializer::ReadVertex(XmlSerializer *this)

{
  XmlReader *pXVar1;
  aiVector3D aVar2;
  int iVar3;
  undefined8 uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  float fVar5;
  XmlSerializer *this_local;
  float fStack_10;
  aiVector3D vertex;
  
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)((long)&this_local + 4));
  pXVar1 = this->xmlReader;
  uVar4 = std::__cxx11::string::c_str();
  iVar3 = (*pXVar1->_vptr_IIrrXMLReader[7])(pXVar1,uVar4);
  this_local._4_4_ = ai_strtof((char *)CONCAT44(extraout_var,iVar3),(char *)0x0);
  pXVar1 = this->xmlReader;
  uVar4 = std::__cxx11::string::c_str();
  iVar3 = (*pXVar1->_vptr_IIrrXMLReader[7])(pXVar1,uVar4);
  fStack_10 = ai_strtof((char *)CONCAT44(extraout_var_00,iVar3),(char *)0x0);
  pXVar1 = this->xmlReader;
  uVar4 = std::__cxx11::string::c_str();
  iVar3 = (*pXVar1->_vptr_IIrrXMLReader[7])(pXVar1,uVar4);
  fVar5 = ai_strtof((char *)CONCAT44(extraout_var_01,iVar3),(char *)0x0);
  aVar2.y = fStack_10;
  aVar2.x = this_local._4_4_;
  aVar2.z = fVar5;
  return aVar2;
}

Assistant:

aiVector3D ReadVertex() {
        aiVector3D vertex;

        vertex.x = ai_strtof(xmlReader->getAttributeValue(D3MF::XmlTag::x.c_str()), nullptr);
        vertex.y = ai_strtof(xmlReader->getAttributeValue(D3MF::XmlTag::y.c_str()), nullptr);
        vertex.z = ai_strtof(xmlReader->getAttributeValue(D3MF::XmlTag::z.c_str()), nullptr);

        return vertex;
    }